

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void ResetLineAfterWrap(TidyPrintImpl *pprint)

{
  uint *puVar1;
  Bool BVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  uint *puVar7;
  
  uVar5 = (ulong)pprint->wraphere;
  uVar3 = 0;
  if (pprint->wraphere < pprint->linelen) {
    puVar6 = pprint->linebuf;
    puVar7 = puVar6 + uVar5;
    puVar1 = puVar6 + pprint->linelen;
    BVar2 = IsWrapInAttrVal(pprint);
    if (BVar2 == no) {
      while( true ) {
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
        if ((puVar1 <= puVar7) || (*puVar7 != 0x20)) break;
        puVar7 = puVar7 + 1;
        pprint->wraphere = uVar4;
      }
    }
    for (; puVar7 < puVar1; puVar7 = puVar7 + 1) {
      *puVar6 = *puVar7;
      puVar6 = puVar6 + 1;
    }
    uVar3 = pprint->linelen - pprint->wraphere;
  }
  pprint->linelen = uVar3;
  ResetLine(pprint);
  return;
}

Assistant:

static void ResetLineAfterWrap( TidyPrintImpl* pprint )
{
    if ( pprint->linelen > pprint->wraphere )
    {
        uint *p = pprint->linebuf;
        uint *q = p + pprint->wraphere;
        uint *end = p + pprint->linelen;

        if ( ! IsWrapInAttrVal(pprint) )
        {
            while ( q < end && *q == ' ' )
                ++q, ++pprint->wraphere;
        }

        while ( q < end )
            *p++ = *q++;

        pprint->linelen -= pprint->wraphere;
    }
    else
    {
        pprint->linelen = 0;
    }

    ResetLine( pprint );
}